

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::SetVariableRequest>::destruct
          (BasicTypeInfo<dap::SetVariableRequest> *this,void *ptr)

{
  if (*(long **)((long)ptr + 0x28) != (long *)((long)ptr + 0x38)) {
    operator_delete(*(long **)((long)ptr + 0x28),*(long *)((long)ptr + 0x38) + 1);
  }
  if (*(long **)((long)ptr + 8) != (long *)((long)ptr + 0x18)) {
    operator_delete(*(long **)((long)ptr + 8),*(long *)((long)ptr + 0x18) + 1);
    return;
  }
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }